

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.c
# Opt level: O2

void alloc_free(void *ptr)

{
  free(ptr);
  return;
}

Assistant:

static void
alloc_free(void* ptr)
{
  if (ptr == NULL) {
#ifdef DEBUG
    /* catch NULL pointers passed to frees in debug mode */
    PANIC(__FUNCTION__, __FILE__, __LINE__);
#else
    /* if we are not in debug mode this case will be ignored for stability */
    return;
#endif /* DEBUG */
  }
  free(ptr);
}